

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

Vec_Int_t * Aig_ManPartitionDfs(Aig_Man_t *p,int nPartSize,int fPreorder)

{
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  undefined4 local_38;
  undefined4 local_34;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vId2Part;
  int fPreorder_local;
  int nPartSize_local;
  Aig_Man_t *p_local;
  
  local_38 = 0;
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Vec_IntStart(iVar1);
  if (fPreorder == 0) {
    pObj = (Aig_Obj_t *)Aig_ManDfs(p,1);
    local_34 = Vec_PtrSize((Vec_Ptr_t *)pObj);
    while (local_34 = local_34 + -1, -1 < local_34) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_34);
      iVar1 = Aig_ObjId(pAVar2);
      Vec_IntWriteEntry(p_00,iVar1,local_38 / nPartSize);
      local_38 = local_38 + 1;
    }
  }
  else {
    pObj = (Aig_Obj_t *)Aig_ManDfsPreorder(p,1);
    for (local_34 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_34 < iVar1;
        local_34 = local_34 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_34);
      iVar1 = Aig_ObjId(pAVar2);
      Vec_IntWriteEntry(p_00,iVar1,local_38 / nPartSize);
      local_38 = local_38 + 1;
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)pObj);
  return p_00;
}

Assistant:

Vec_Int_t * Aig_ManPartitionDfs( Aig_Man_t * p, int nPartSize, int fPreorder )
{
    Vec_Int_t * vId2Part; 
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    if ( fPreorder )
    {
        vNodes = Aig_ManDfsPreorder( p, 1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    else
    {
        vNodes = Aig_ManDfs( p, 1 );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    Vec_PtrFree( vNodes );
    return vId2Part;
}